

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::FileInputStream::tryRead(FileInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  FixVoid<unsigned_long> value;
  
  value = (**(code **)(**(long **)((long)buffer + 8) + 0x30))
                    (*(long **)((long)buffer + 8),*(undefined8 *)((long)buffer + 0x10));
  *(long *)((long)buffer + 0x10) = *(long *)((long)buffer + 0x10) + value;
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,value);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> FileInputStream::tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
  // Note that our contract with `minBytes` is that we should only return fewer than `minBytes` on
  // EOF. A file read will only produce fewer than the requested number of bytes if EOF was reached.
  // `minBytes` cannot be greater than `maxBytes`. So, this read satisfies the `minBytes`
  // requirement.
  size_t result = file.read(offset, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes));
  offset += result;
  return result;
}